

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall file_base_0::test_method(file_base_0 *this)

{
  shared_count *this_00;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char *local_b8;
  const_string local_b0;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  char **local_88;
  assertion_result local_80;
  undefined **local_68;
  undefined1 local_60;
  undefined1 *local_58;
  char ***local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 10;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_48 = &local_38;
  local_38 = "a";
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_60 = 0;
  local_88 = &local_40;
  local_40 = "a";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b79f8;
  local_50 = &local_48;
  local_68 = &PTR__lazy_ostream_001b79b8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_90 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,10,CHECK,CHECK_EQUAL,2,"ah::file_base( \"a\" )",&local_68
             ,"\"a\"",&local_a0);
  this_00 = &local_80.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_38 = "a.txt";
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_48 = &local_38;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_001b79b8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = &local_48;
  local_40 = "a.txt";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b7a38;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0xb,CHECK,CHECK_EQUAL,2,"ah::file_base( \"a.txt\" )",
             &local_68,"\"a.txt\"",&local_a0);
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xc;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_38 = ".a.txt";
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_48 = &local_38;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_001b79b8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = &local_48;
  local_40 = ".a.txt";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b7a78;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0xc,CHECK,CHECK_EQUAL,2,"ah::file_base( \".a.txt\" )",
             &local_68,"\".a.txt\"",&local_a0);
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xd;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_38 = "c:\\asd\\.a.txt";
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_48 = &local_38;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_001b79b8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = &local_48;
  local_40 = "c:\\asd\\.a.txt";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b7ab8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0xd,CHECK,CHECK_EQUAL,2,
             "ah::file_base( \"c:\\\\asd\\\\.a.txt\" )",&local_68,"\"c:\\\\asd\\\\.a.txt\"",
             &local_a0);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_base_0 )
{
    BOOST_CHECK_EQUAL( ah::file_base( "a" ), "a" );
    BOOST_CHECK_EQUAL( ah::file_base( "a.txt" ), "a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( ".a.txt" ), ".a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( "c:\\asd\\.a.txt" ), "c:\\asd\\.a.txt" );
}